

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
::FindEntryWithKey<JsUtil::CharacterBuffer<char16_t>>
          (BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
           *this,CharacterBuffer<char16_t> *key)

{
  long lVar1;
  long lVar2;
  JavascriptString *pJVar3;
  char16_t *string2;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  charcount_t cVar7;
  hash_t hVar8;
  int iVar9;
  undefined4 *puVar10;
  char16 *pcVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  hash_t hashCode;
  uint depth;
  
  lVar2 = *(long *)this;
  depth = 0;
  if (lVar2 != 0) {
    if ((ulong)key->len == 0) {
      hashCode = 0x2393b8b;
    }
    else {
      uVar13 = 0x811c9dc5;
      uVar12 = 0;
      do {
        uVar15 = (ushort)(key->string).ptr[uVar12] ^ uVar13;
        uVar13 = uVar15 * 0x1000193;
        uVar12 = uVar12 + 1;
      } while (key->len != uVar12);
      hashCode = uVar15 * 0x2000326 + 1;
    }
    uVar6 = BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
            ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar13 = *(uint *)(lVar2 + (ulong)uVar6 * 4);
    if (-1 < (int)uVar13) {
      lVar2 = *(long *)(this + 8);
      depth = 0;
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        pJVar3 = *(JavascriptString **)(lVar2 + 8 + (ulong)uVar13 * 0x18);
        pcVar11 = Js::JavascriptString::GetString(pJVar3);
        cVar7 = Js::JavascriptString::GetLength(pJVar3);
        if (cVar7 == 0) {
          hVar8 = 0x2393b8b;
        }
        else {
          uVar15 = 0x811c9dc5;
          uVar12 = 0;
          do {
            uVar14 = (ushort)pcVar11[uVar12] ^ uVar15;
            uVar15 = uVar14 * 0x1000193;
            uVar12 = uVar12 + 1;
          } while (cVar7 != uVar12);
          hVar8 = uVar14 * 0x2000326 + 1;
        }
        lVar1 = lVar2 + (ulong)uVar13 * 0x18;
        if (hVar8 != *(hash_t *)(lVar1 + 0x10)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                             ,199,
                             "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                             ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
          if (!bVar5) {
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar10 = 0;
          hVar8 = *(hash_t *)(lVar1 + 0x10);
        }
        if (hVar8 == hashCode) {
          pJVar3 = *(JavascriptString **)(lVar1 + 8);
          cVar7 = Js::JavascriptString::GetLength(pJVar3);
          if (cVar7 == key->len) {
            pcVar11 = Js::JavascriptString::GetString(pJVar3);
            string2 = (key->string).ptr;
            cVar7 = Js::JavascriptString::GetLength(pJVar3);
            if ((pcVar11 == string2) ||
               (iVar9 = PAL_wmemcmp(pcVar11,string2,(ulong)cVar7), iVar9 == 0)) {
              if (*(DictionaryStats **)(this + 0x30) == (DictionaryStats *)0x0) {
                return uVar13;
              }
              DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
              return uVar13;
            }
          }
        }
        depth = depth + 1;
        uVar13 = *(uint *)(lVar1 + 4);
      } while (-1 < (int)uVar13);
    }
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
  }
  return -1;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }